

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TreePatterns.cpp
# Opt level: O1

bool __thiscall
IRT::ConstPlusRegPattern::TryToGenerateCode
          (ConstPlusRegPattern *this,INode *tree,CTemp *dest,ChildrenTemps *children,
          AssemblyCommands *commands)

{
  TOperationType TVar1;
  int iVar2;
  CBinopExpression *this_00;
  CExpression *pCVar3;
  CConstExpression *this_01;
  CTempExpression *this_02;
  CTemp *__args_1;
  INode *pIVar4;
  CTemp rightRegister;
  undefined1 local_a0 [32];
  INode *local_80;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_78;
  undefined1 local_68;
  _Alloc_hider _Stack_60;
  INode *local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  if (tree == (INode *)0x0) {
    this_00 = (CBinopExpression *)0x0;
  }
  else {
    this_00 = (CBinopExpression *)
              __dynamic_cast(tree,&INode::typeinfo,&CBinopExpression::typeinfo,0);
  }
  if ((this_00 != (CBinopExpression *)0x0) &&
     (TVar1 = CBinopExpression::getOperation(this_00), TVar1 == PLUS)) {
    pCVar3 = CBinopExpression::getLeftOperand(this_00);
    if (pCVar3 == (CExpression *)0x0) {
      this_01 = (CConstExpression *)0x0;
    }
    else {
      this_01 = (CConstExpression *)
                __dynamic_cast(pCVar3,&CExpression::typeinfo,&CConstExpression::typeinfo,0);
    }
    if (this_01 != (CConstExpression *)0x0) {
      pCVar3 = CBinopExpression::getRightOperand(this_00);
      if (pCVar3 == (CExpression *)0x0) {
        this_02 = (CTempExpression *)0x0;
      }
      else {
        this_02 = (CTempExpression *)
                  __dynamic_cast(pCVar3,&CExpression::typeinfo,&CTempExpression::typeinfo,0);
      }
      if (this_02 == (CTempExpression *)0x0) {
        CTemp::CTemp((CTemp *)&local_50);
        pIVar4 = (INode *)CBinopExpression::getLeftOperand(this_00);
        local_78._M_allocated_capacity = (size_type)(element_type *)&local_68;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_78,local_50._M_allocated_capacity,
                   (undefined1 *)(local_50._8_8_ + local_50._M_allocated_capacity));
        local_a0._0_8_ = local_a0 + 0x10;
        if ((element_type *)local_78._M_allocated_capacity == (element_type *)&local_68) {
          local_a0._24_8_ = _Stack_60._M_p;
        }
        else {
          local_a0._0_8_ = local_78._M_allocated_capacity;
        }
        local_a0._8_8_ = local_78._8_8_;
        local_78._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_68 = 0;
        local_80 = pIVar4;
        local_78._M_allocated_capacity = (size_type)(element_type *)&local_68;
        local_58 = pIVar4;
        std::
        vector<std::pair<IRT::CTemp,IRT::INode_const*>,std::allocator<std::pair<IRT::CTemp,IRT::INode_const*>>>
        ::emplace_back<std::pair<IRT::CTemp,IRT::INode_const*>>
                  ((vector<std::pair<IRT::CTemp,IRT::INode_const*>,std::allocator<std::pair<IRT::CTemp,IRT::INode_const*>>>
                    *)children,(pair<IRT::CTemp,_const_IRT::INode_*> *)local_a0);
        if ((element_type *)local_a0._0_8_ != (element_type *)(local_a0 + 0x10)) {
          operator_delete((void *)local_a0._0_8_);
        }
        if ((element_type *)local_78._M_allocated_capacity != (element_type *)&local_68) {
          operator_delete((void *)local_78._M_allocated_capacity);
        }
        local_a0._0_8_ = (element_type *)0x0;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
        __shared_count<AssemblyCode::MoveRegRegCommand,std::allocator<AssemblyCode::MoveRegRegCommand>,IRT::CTemp_const&,IRT::CTemp&>
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_a0 + 8),
                   (MoveRegRegCommand **)local_a0,
                   (allocator<AssemblyCode::MoveRegRegCommand> *)&local_78,dest,(CTemp *)&local_50);
        std::
        vector<std::shared_ptr<AssemblyCode::AssemblyCommand>,std::allocator<std::shared_ptr<AssemblyCode::AssemblyCommand>>>
        ::emplace_back<std::shared_ptr<AssemblyCode::MoveRegRegCommand>>
                  ((vector<std::shared_ptr<AssemblyCode::AssemblyCommand>,std::allocator<std::shared_ptr<AssemblyCode::AssemblyCommand>>>
                    *)commands,(shared_ptr<AssemblyCode::MoveRegRegCommand> *)local_a0);
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a0._8_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a0._8_8_);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_allocated_capacity != &local_40) {
          operator_delete((void *)local_50._M_allocated_capacity);
        }
      }
      else {
        __args_1 = CTempExpression::getTemprorary(this_02);
        local_a0._0_8_ = (element_type *)0x0;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
        __shared_count<AssemblyCode::MoveRegRegCommand,std::allocator<AssemblyCode::MoveRegRegCommand>,IRT::CTemp_const&,IRT::CTemp_const&>
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_a0 + 8),
                   (MoveRegRegCommand **)local_a0,
                   (allocator<AssemblyCode::MoveRegRegCommand> *)&local_78,dest,__args_1);
        std::
        vector<std::shared_ptr<AssemblyCode::AssemblyCommand>,std::allocator<std::shared_ptr<AssemblyCode::AssemblyCommand>>>
        ::emplace_back<std::shared_ptr<AssemblyCode::MoveRegRegCommand>>
                  ((vector<std::shared_ptr<AssemblyCode::AssemblyCommand>,std::allocator<std::shared_ptr<AssemblyCode::AssemblyCommand>>>
                    *)commands,(shared_ptr<AssemblyCode::MoveRegRegCommand> *)local_a0);
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a0._8_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a0._8_8_);
        }
      }
      iVar2 = CConstExpression::getValue(this_01);
      local_78._M_allocated_capacity._0_4_ = iVar2;
      local_a0._0_8_ = (element_type *)0x0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<AssemblyCode::AddRegConstCommand,std::allocator<AssemblyCode::AddRegConstCommand>,IRT::CTemp_const&,int>
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_a0 + 8),
                 (AddRegConstCommand **)local_a0,
                 (allocator<AssemblyCode::AddRegConstCommand> *)&local_50,dest,
                 (int *)local_78._M_local_buf);
      std::
      vector<std::shared_ptr<AssemblyCode::AssemblyCommand>,std::allocator<std::shared_ptr<AssemblyCode::AssemblyCommand>>>
      ::emplace_back<std::shared_ptr<AssemblyCode::AddRegConstCommand>>
                ((vector<std::shared_ptr<AssemblyCode::AssemblyCommand>,std::allocator<std::shared_ptr<AssemblyCode::AssemblyCommand>>>
                  *)commands,(shared_ptr<AssemblyCode::AddRegConstCommand> *)local_a0);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a0._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a0._8_8_);
      }
      return true;
    }
  }
  return false;
}

Assistant:

bool
IRT::ConstPlusRegPattern::TryToGenerateCode( const IRT::INode *tree, const IRT::CTemp &dest, ChildrenTemps &children,
                                             AssemblyCommands &commands ) {
    ConstBinopPtr binopPtr = dynamic_cast<ConstBinopPtr>(tree);
    if ( binopPtr && binopPtr->getOperation( ) == IRT::enums::TOperationType::PLUS ) {
        ConstConstPtr constPtr = dynamic_cast<ConstConstPtr>(binopPtr->getLeftOperand( ));
        if ( constPtr ) {
            ConstTempPtr rightRegisterPtr = dynamic_cast<ConstTempPtr>(binopPtr->getRightOperand( ));
            if ( rightRegisterPtr ) {
                commands.emplace_back(
                        std::make_shared<AssemblyCode::MoveRegRegCommand>( dest, rightRegisterPtr->getTemprorary( )));
            } else {
                CTemp rightRegister;
                children.push_back( std::make_pair( rightRegister, binopPtr->getLeftOperand( )));
                commands.emplace_back( std::make_shared<AssemblyCode::MoveRegRegCommand>( dest, rightRegister ));
            }
            commands.emplace_back( std::make_shared<AssemblyCode::AddRegConstCommand>( dest, constPtr->getValue( )));
            return true;
        }
    }
    return false;
}